

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.hxx
# Opt level: O0

void __thiscall cmsys::RegularExpression::RegularExpression(RegularExpression *this,string *s)

{
  string *s_local;
  RegularExpression *this_local;
  
  RegularExpressionMatch::RegularExpressionMatch(&this->regmatch);
  this->regstart = '\0';
  this->reganch = '\0';
  this->regmust = (char *)0x0;
  this->program = (char *)0x0;
  this->progsize = 0;
  compile(this,s);
  return;
}

Assistant:

inline RegularExpression::RegularExpression(const std::string& s)
  : regstart{}
  , reganch{}
  , regmust{}
  , program{ nullptr }
  , progsize{}
{
  this->compile(s);
}